

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void * fio_message_metadata(fio_msg_s *msg,intptr_t type_id)

{
  size_t sVar1;
  size_t local_30;
  size_t len;
  fio_msg_metadata_s *meta;
  intptr_t type_id_local;
  fio_msg_s *msg_local;
  
  sVar1 = msg[1].channel.len;
  local_30 = msg[1].channel.capa;
  do {
    if (local_30 == 0) {
      return (void *)0x0;
    }
    local_30 = local_30 - 1;
  } while (*(long *)(sVar1 + local_30 * 0x18) != type_id);
  return *(void **)(sVar1 + local_30 * 0x18 + 0x10);
}

Assistant:

void *fio_message_metadata(fio_msg_s *msg, intptr_t type_id) {
  fio_msg_metadata_s *meta = ((fio_msg_client_s *)msg)->meta;
  size_t len = ((fio_msg_client_s *)msg)->meta_len;
  while (len) {
    --len;
    if (meta[len].type_id == type_id)
      return meta[len].metadata;
  }
  return NULL;
}